

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O0

int32 get_scores_8b_feat_6(s2_semi_mgau_t *s,int i,int32 *senone_scores,uint8 *senone_active)

{
  uint8 *puVar1;
  uint8 *puVar2;
  uint8 *puVar3;
  uint8 *puVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  int iVar7;
  int32 tmp;
  uint8 *pid_cw5;
  uint8 *pid_cw4;
  uint8 *pid_cw3;
  uint8 *pid_cw2;
  uint8 *pid_cw1;
  uint8 *pid_cw0;
  int32 j;
  uint8 *senone_active_local;
  int32 *senone_scores_local;
  int i_local;
  s2_semi_mgau_t *s_local;
  
  puVar1 = s->mixw[i][s->f[i]->codeword];
  puVar2 = s->mixw[i][s->f[i][1].codeword];
  puVar3 = s->mixw[i][s->f[i][2].codeword];
  puVar4 = s->mixw[i][s->f[i][3].codeword];
  puVar5 = s->mixw[i][s->f[i][4].codeword];
  puVar6 = s->mixw[i][s->f[i][5].codeword];
  for (pid_cw0._4_4_ = 0; pid_cw0._4_4_ < s->n_sen; pid_cw0._4_4_ = pid_cw0._4_4_ + 1) {
    if (senone_active[pid_cw0._4_4_] != '\0') {
      iVar7 = fast_logmath_add(s->lmath_8b,(uint)puVar1[pid_cw0._4_4_] + s->f[i]->score,
                               (uint)puVar2[pid_cw0._4_4_] + s->f[i][1].score);
      iVar7 = fast_logmath_add(s->lmath_8b,iVar7,(uint)puVar3[pid_cw0._4_4_] + s->f[i][2].score);
      iVar7 = fast_logmath_add(s->lmath_8b,iVar7,(uint)puVar4[pid_cw0._4_4_] + s->f[i][3].score);
      iVar7 = fast_logmath_add(s->lmath_8b,iVar7,(uint)puVar5[pid_cw0._4_4_] + s->f[i][4].score);
      iVar7 = fast_logmath_add(s->lmath_8b,iVar7,(uint)puVar6[pid_cw0._4_4_] + s->f[i][5].score);
      senone_scores[pid_cw0._4_4_] = senone_scores[pid_cw0._4_4_] + iVar7 * -0x400;
    }
  }
  return 0;
}

Assistant:

static int32
get_scores_8b_feat_6(s2_semi_mgau_t * s, int i,
                     int32 *senone_scores, uint8 *senone_active)
{
    int32 j;
    uint8 *pid_cw0, *pid_cw1, *pid_cw2, *pid_cw3, *pid_cw4, *pid_cw5;

    pid_cw0 = s->mixw[i][s->f[i][0].codeword];
    pid_cw1 = s->mixw[i][s->f[i][1].codeword];
    pid_cw2 = s->mixw[i][s->f[i][2].codeword];
    pid_cw3 = s->mixw[i][s->f[i][3].codeword];
    pid_cw4 = s->mixw[i][s->f[i][4].codeword];
    pid_cw5 = s->mixw[i][s->f[i][5].codeword];

    for (j = 0; j < s->n_sen; j++) {
        int32 tmp;

        if (!senone_active[j]) continue;
        tmp = pid_cw0[j] + s->f[i][0].score;
        tmp = fast_logmath_add(s->lmath_8b, tmp,
                               pid_cw1[j] + s->f[i][1].score);
        tmp = fast_logmath_add(s->lmath_8b, tmp,
                               pid_cw2[j] + s->f[i][2].score);
        tmp = fast_logmath_add(s->lmath_8b, tmp,
                               pid_cw3[j] + s->f[i][3].score);
        tmp = fast_logmath_add(s->lmath_8b, tmp,
                               pid_cw4[j] + s->f[i][4].score);
        tmp = fast_logmath_add(s->lmath_8b, tmp,
                               pid_cw5[j] + s->f[i][5].score);

        senone_scores[j] -= (tmp << SENSCR_SHIFT);
    }
    return 0;
}